

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoboSimian.cpp
# Opt level: O3

void __thiscall
chrono::robosimian::ContactMaterial::ContactMaterial(ContactMaterial *this,RoboSimian *robot)

{
  ChSystem *pCVar1;
  long *plVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  shared_ptr<chrono::robosimian::ContactMaterial> shared_this;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_30;
  ContactMaterial *local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_20;
  
  (this->super_AddContactCallback)._vptr_AddContactCallback =
       (_func_int **)&PTR__AddContactCallback_0017dac8;
  this->m_robot = robot;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::robosimian::ContactMaterial*,chrono::robosimian::ContactMaterial::ContactMaterial(chrono::robosimian::RoboSimian*)::_lambda(chrono::robosimian::ContactMaterial*)_1_,std::allocator<void>,void>
            (&_Stack_30,this);
  pCVar1 = this->m_robot->m_system;
  plVar2 = *(long **)(pCVar1 + 0x158);
  this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(pCVar1 + 0x160);
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  p_Stack_20 = _Stack_30._M_pi;
  if (_Stack_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (_Stack_30._M_pi)->_M_use_count = (_Stack_30._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (_Stack_30._M_pi)->_M_use_count = (_Stack_30._M_pi)->_M_use_count + 1;
    }
  }
  local_28 = this;
  (**(code **)(*plVar2 + 0x210))(plVar2,&local_28);
  if (p_Stack_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_20);
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (_Stack_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_30._M_pi);
  }
  return;
}

Assistant:

ContactMaterial(RoboSimian* robot) : m_robot(robot) {
        std::shared_ptr<ContactMaterial> shared_this(this, [](ContactMaterial*) {});
        m_robot->GetSystem()->GetContactContainer()->RegisterAddContactCallback(shared_this);
    }